

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Amd.h
# Opt level: O2

int Eigen::internal::cs_tdfs<int>(int j,int k,int *head,int *next,int *post,int *stack)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)(head == (int *)0x0);
  auVar6._4_4_ = -(uint)(next == (int *)0x0);
  auVar6._8_4_ = -(uint)(post == (int *)0x0);
  auVar6._12_4_ = -(uint)(stack == (int *)0x0);
  iVar2 = movmskps(k,auVar6);
  if (iVar2 != 0) {
    return -1;
  }
  *stack = j;
  uVar3 = 0;
  do {
    uVar4 = (ulong)uVar3;
    while( true ) {
      if ((int)uVar4 < 0) {
        return k;
      }
      iVar2 = stack[uVar4];
      iVar1 = head[iVar2];
      if ((long)iVar1 == -1) break;
      head[iVar2] = next[iVar1];
      uVar4 = uVar4 + 1;
      stack[uVar4 & 0xffffffff] = iVar1;
    }
    uVar3 = (int)uVar4 - 1;
    lVar5 = (long)k;
    k = k + 1;
    post[lVar5] = iVar2;
  } while( true );
}

Assistant:

StorageIndex cs_tdfs(StorageIndex j, StorageIndex k, StorageIndex *head, const StorageIndex *next, StorageIndex *post, StorageIndex *stack)
{
  StorageIndex i, p, top = 0;
  if(!head || !next || !post || !stack) return (-1);    /* check inputs */
  stack[0] = j;                 /* place j on the stack */
  while (top >= 0)                /* while (stack is not empty) */
  {
    p = stack[top];           /* p = top of stack */
    i = head[p];              /* i = youngest child of p */
    if(i == -1)
    {
      top--;                 /* p has no unordered children left */
      post[k++] = p;        /* node p is the kth postordered node */
    }
    else
    {
      head[p] = next[i];   /* remove i from children of p */
      stack[++top] = i;     /* start dfs on child node i */
    }
  }
  return k;
}